

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O3

uchar getCostT<2>(uchar **Grid2D,int x,int y,int param_4)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  
  bVar3 = Grid2D[x * 2][(long)y * 2];
  uVar5 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    uVar7 = 0;
    bVar2 = true;
    do {
      bVar6 = bVar2;
      bVar1 = Grid2D[uVar7 | (long)(x * 2)][uVar5 | (long)y * 2];
      if (Grid2D[uVar7 | (long)(x * 2)][uVar5 | (long)y * 2] < bVar3) {
        bVar1 = bVar3;
      }
      bVar3 = bVar1;
      uVar7 = 1;
      bVar2 = false;
    } while (bVar6);
    uVar5 = 1;
    bVar2 = false;
  } while (bVar4);
  return bVar3;
}

Assistant:

unsigned char getCostT(unsigned char **Grid2D, int x, int y, int /*resample*/)
{
    if(N == 1) // the compiler will optimize out this if statement
    {
        return Grid2D[x][y];
    }
    else
    {
        x *= N;
        y *= N;
        unsigned char maximum = Grid2D[x][y];
        for(int dy=0; dy<N; dy++)
            for(int dx=0; dx<N; dx++)
                maximum = __max(maximum, Grid2D[x+dx][y+dy]);

        return maximum;
    }
}